

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int imcomp_copy_overlap(char *tile,int pixlen,int ndim,long *tfpixel,long *tlpixel,char *bnullarray,
                       char *image,long *fpixel,long *lpixel,long *ininc,int nullcheck,
                       char *nullarray,int *status)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *__dest;
  char *__src;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  size_t __n;
  long lVar22;
  char *__dest_00;
  long lVar23;
  long lVar24;
  char *__src_00;
  long lVar25;
  long local_350;
  long local_348;
  long local_340;
  long local_320;
  long tiledim [6];
  long imgdim [6];
  long tilefpix [6];
  long inc [6];
  long imglpix [6];
  long imgfpix [6];
  
  iVar5 = *status;
  if (iVar5 < 1) {
    for (lVar2 = 0; lVar2 != 0x30; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)inc + lVar2) = 1;
      *(undefined8 *)((long)imgdim + lVar2) = 1;
      *(undefined8 *)((long)imgfpix + lVar2) = 0;
      *(undefined8 *)((long)tiledim + lVar2) = 1;
      *(undefined8 *)((long)imglpix + lVar2) = 0;
      *(undefined8 *)((long)tilefpix + lVar2) = 0;
    }
    uVar12 = 0;
    if (0 < ndim) {
      uVar12 = (ulong)(uint)ndim;
    }
    for (uVar21 = 0; uVar21 != uVar12; uVar21 = uVar21 + 1) {
      lVar2 = tlpixel[uVar21];
      lVar14 = fpixel[uVar21];
      if (lVar2 < lVar14) {
        return iVar5;
      }
      lVar15 = tfpixel[uVar21];
      lVar3 = lpixel[uVar21];
      if (lVar3 < lVar15) {
        return iVar5;
      }
      lVar4 = ininc[uVar21];
      lVar13 = -lVar4;
      if (0 < lVar4) {
        lVar13 = lVar4;
      }
      inc[uVar21] = lVar4;
      lVar3 = (lVar3 - lVar14) / lVar13;
      imgdim[uVar21] = lVar3 + 1;
      if (lVar3 < 0) {
LAB_0018763a:
        *status = 0x143;
        return 0x143;
      }
      lVar4 = (lVar2 - lVar15) + 1;
      tiledim[uVar21] = lVar4;
      if (lVar2 - lVar15 < 0) goto LAB_0018763a;
      if (uVar21 != 0) {
        tiledim[uVar21] = lVar4 * tiledim[uVar21 - 1];
      }
      lVar20 = lVar15 - lVar14;
      lVar4 = lVar15 + -1;
      while (lVar20 % lVar13 != 0) {
        lVar20 = lVar20 + 1;
        bVar1 = lVar2 + -1 <= lVar4;
        lVar4 = lVar4 + 1;
        if (bVar1) {
          return iVar5;
        }
      }
      while ((lVar2 - lVar14) % lVar13 != 0) {
        lVar2 = lVar2 + -1;
        if (lVar2 <= lVar4) {
          return iVar5;
        }
      }
      lVar20 = lVar20 / lVar13;
      if (lVar20 < 1) {
        lVar20 = 0;
      }
      imgfpix[uVar21] = lVar20;
      lVar4 = (lVar2 - lVar14) / lVar13;
      lVar2 = lVar3;
      if (lVar4 < lVar3) {
        lVar2 = lVar4;
      }
      imglpix[uVar21] = lVar2;
      lVar2 = lVar14 - lVar15;
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      while ((lVar2 + (lVar15 - lVar14)) % lVar13 != 0) {
        lVar2 = lVar2 + 1;
        if (tiledim[uVar21] <= lVar2) {
          tilefpix[uVar21] = lVar2;
          return iVar5;
        }
      }
      tilefpix[uVar21] = lVar2;
      if (uVar21 != 0) {
        imgdim[uVar21] = (lVar3 + 1) * tiledim[uVar21 + 5];
      }
    }
    iVar5 = 1;
    if (inc[0] == 1) {
      iVar5 = ((int)imglpix[0] - (int)imgfpix[0]) + 1;
    }
    __n = (size_t)iVar5;
    lVar2 = -inc[4];
    if (0 < inc[4]) {
      lVar2 = inc[4];
    }
    lVar14 = -inc[3];
    if (0 < inc[3]) {
      lVar14 = inc[3];
    }
    lVar15 = -inc[2];
    if (0 < inc[2]) {
      lVar15 = inc[2];
    }
    lVar3 = -inc[1];
    if (0 < inc[1]) {
      lVar3 = inc[1];
    }
    sVar16 = -__n;
    lVar4 = ~imgfpix[0] + imgdim[0];
    if (0 < inc[0]) {
      sVar16 = __n;
      lVar4 = imgfpix[0];
    }
    lVar13 = -inc[0];
    if (inc[0] != lVar13 && SBORROW8(inc[0],lVar13) == inc[0] * 2 < 0) {
      lVar13 = inc[0];
    }
    lVar20 = (long)pixlen;
    local_350 = 0;
    for (lVar18 = 0; lVar19 = local_350, lVar18 <= imglpix[4] - imgfpix[4]; lVar18 = lVar18 + 1) {
      for (; (lVar6 = local_350, 4 < ndim &&
             (lVar6 = lVar19, ((tfpixel[4] - fpixel[4]) + tilefpix[4] + lVar19) % lVar2 != 0));
          lVar19 = lVar19 + 1) {
      }
      local_350 = lVar6;
      if (inc[4] < 1) {
        lVar19 = imgdim[4] - (imgfpix[4] + lVar18 + 1) * imgdim[3];
      }
      else {
        lVar19 = (imgfpix[4] + lVar18) * imgdim[3];
      }
      lVar6 = (local_350 + tilefpix[4]) * tiledim[3];
      local_348 = 0;
      for (lVar23 = 0; lVar9 = local_348, lVar23 <= imglpix[3] - imgfpix[3]; lVar23 = lVar23 + 1) {
        for (; (lVar7 = local_348, 3 < ndim &&
               (lVar7 = lVar9, ((tfpixel[3] - fpixel[3]) + tilefpix[3] + lVar9) % lVar14 != 0));
            lVar9 = lVar9 + 1) {
        }
        local_348 = lVar7;
        if (inc[3] < 1) {
          lVar9 = imgdim[3] - (imgfpix[3] + lVar23 + 1) * imgdim[2];
        }
        else {
          lVar9 = (imgfpix[3] + lVar23) * imgdim[2];
        }
        lVar7 = (local_348 + tilefpix[3]) * tiledim[2];
        local_340 = 0;
        for (lVar25 = 0; lVar22 = local_340, lVar25 <= imglpix[2] - imgfpix[2]; lVar25 = lVar25 + 1)
        {
          for (; (lVar8 = local_340, 2 < ndim &&
                 (lVar8 = lVar22, ((tfpixel[2] - fpixel[2]) + tilefpix[2] + lVar22) % lVar15 != 0));
              lVar22 = lVar22 + 1) {
          }
          local_340 = lVar8;
          if (inc[2] < 1) {
            lVar22 = imgdim[2] - (imgfpix[2] + lVar25 + 1) * imgdim[1];
          }
          else {
            lVar22 = (imgfpix[2] + lVar25) * imgdim[1];
          }
          lVar8 = (local_340 + tilefpix[2]) * tiledim[1];
          local_320 = 0;
          for (lVar11 = 0; lVar10 = local_320, lVar11 <= imglpix[1] - imgfpix[1];
              lVar11 = lVar11 + 1) {
            for (; (lVar17 = local_320, 1 < ndim &&
                   (lVar17 = lVar10, ((tfpixel[1] - fpixel[1]) + tilefpix[1] + lVar10) % lVar3 != 0)
                   ); lVar10 = lVar10 + 1) {
            }
            if (inc[1] < 1) {
              lVar10 = imgdim[1] - (imgfpix[1] + lVar11 + 1) * imgdim[0];
            }
            else {
              lVar10 = (imgfpix[1] + lVar11) * imgdim[0];
            }
            lVar24 = (tilefpix[1] + lVar17) * tiledim[0];
            __src = tile + (tilefpix[0] + lVar6 + lVar7 + lVar8 + lVar24) * lVar20;
            __src_00 = bnullarray + lVar24 + lVar8 + lVar7 + lVar6 + tilefpix[0];
            __dest_00 = image + (lVar9 + lVar19 + lVar22 + lVar4 + lVar10) * lVar20;
            __dest = nullarray + lVar10 + lVar22 + lVar9 + lVar19 + lVar4;
            for (lVar10 = imgfpix[0]; lVar10 <= imglpix[0]; lVar10 = lVar10 + __n) {
              if (nullcheck == 2) {
                memcpy(__dest,__src_00,__n);
              }
              memcpy(__dest_00,__src,(long)(iVar5 * pixlen));
              __src = __src + lVar13 * __n * lVar20;
              __src_00 = __src_00 + lVar13 * __n;
              __dest_00 = __dest_00 + sVar16 * lVar20;
              __dest = __dest + sVar16;
            }
            local_320 = lVar17 + 1;
          }
          local_340 = local_340 + 1;
        }
        local_348 = local_348 + 1;
      }
      local_350 = local_350 + 1;
    }
    iVar5 = *status;
  }
  return iVar5;
}

Assistant:

int imcomp_copy_overlap (
    char *tile,         /* I - multi dimensional array of tile pixels */
    int pixlen,         /* I - number of bytes in each tile or image pixel */
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    char *bnullarray,   /* I - array of null flags; used if nullcheck = 2 */
    char *image,        /* O - multi dimensional output image */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    long *ininc,        /* I - increment to be applied in each image dimen. */
    int nullcheck,      /* I - 0, 1: do nothing; 2: set nullarray for nulls */
    char *nullarray, 
    int *status)

/* 
  copy the intersecting pixels from a decompressed tile to the output image. 
  Both the tile and the image must have the same number of dimensions. 
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    long i1, i2, i3, i4;   /* offset along each axis of the image */
    long it1, it2, it3, it4;
    long im1, im2, im3, im4;  /* offset to image pixel, allowing for inc */
    long ipos, tf, tl;
    long t2, t3, t4;   /* offset along each axis of the tile */
    long tilepix, imgpix, tilepixbyte, imgpixbyte;
    int ii, overlap_bytes, overlap_flags;

    if (*status > 0)
        return(*status);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        /* set default values for higher dimensions */
        inc[ii] = 1;
        imgdim[ii] = 1;
        tiledim[ii] = 1;
        imgfpix[ii] = 0;
        imglpix[ii] = 0;
        tilefpix[ii] = 0;
    }

    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(*status);  /* there are no overlapping pixels */

        inc[ii] = ininc[ii];

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1)
            return(*status = NEG_AXIS);

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1)
            return(*status = NEG_AXIS);

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(*status);  /* no overlapping pixels */
        }
/*
printf("ii tfpixel, tlpixel %d %d %d \n",ii, tfpixel[ii], tlpixel[ii]);
printf("ii, tf, tl, imgfpix,imglpix, tilefpix %d %d %d %d %d %d\n",ii,
 tf,tl,imgfpix[ii], imglpix[ii],tilefpix[ii]);
*/
        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    /* ---------------------------------------------------------------- */
    /* calc number of pixels in each row (first dimension) that overlap */
    /* multiply by pixlen to get number of bytes to copy in each loop   */
    /* ---------------------------------------------------------------- */

    if (inc[0] != 1)
       overlap_flags = 1;  /* can only copy 1 pixel at a time */
    else
       overlap_flags = imglpix[0] - imgfpix[0] + 1;  /* can copy whole row */

    overlap_bytes = overlap_flags * pixlen;

    /* support up to 5 dimensions for now */
    for (i4 = 0, it4=0; i4 <= imglpix[4] - imgfpix[4]; i4++, it4++)
    {
     /* increment plane if it falls in the cracks of the subsampled image */
     while (ndim > 4 &&  (tfpixel[4] + tilefpix[4] - fpixel[4] + it4)
                          % labs(inc[4]) != 0)
        it4++;

       /* offset to start of hypercube */
       if (inc[4] > 0)
          im4 = (i4 + imgfpix[4]) * imgdim[3];
       else
          im4 = imgdim[4] - (i4 + 1 + imgfpix[4]) * imgdim[3];

      t4 = (tilefpix[4] + it4) * tiledim[3];
      for (i3 = 0, it3=0; i3 <= imglpix[3] - imgfpix[3]; i3++, it3++)
      {
       /* increment plane if it falls in the cracks of the subsampled image */
       while (ndim > 3 &&  (tfpixel[3] + tilefpix[3] - fpixel[3] + it3)
                            % labs(inc[3]) != 0)
          it3++;

       /* offset to start of cube */
       if (inc[3] > 0)
          im3 = (i3 + imgfpix[3]) * imgdim[2] + im4;
       else
          im3 = imgdim[3] - (i3 + 1 + imgfpix[3]) * imgdim[2] + im4;

       t3 = (tilefpix[3] + it3) * tiledim[2] + t4;

       /* loop through planes of the image */
       for (i2 = 0, it2=0; i2 <= imglpix[2] - imgfpix[2]; i2++, it2++)
       {
          /* incre plane if it falls in the cracks of the subsampled image */
          while (ndim > 2 &&  (tfpixel[2] + tilefpix[2] - fpixel[2] + it2)
                               % labs(inc[2]) != 0)
             it2++;

          /* offset to start of plane */
          if (inc[2] > 0)
             im2 = (i2 + imgfpix[2]) * imgdim[1] + im3;
          else
             im2 = imgdim[2] - (i2 + 1 + imgfpix[2]) * imgdim[1] + im3;

          t2 = (tilefpix[2] + it2) * tiledim[1] + t3;

          /* loop through rows of the image */
          for (i1 = 0, it1=0; i1 <= imglpix[1] - imgfpix[1]; i1++, it1++)
          {
             /* incre row if it falls in the cracks of the subsampled image */
             while (ndim > 1 &&  (tfpixel[1] + tilefpix[1] - fpixel[1] + it1)
                                  % labs(inc[1]) != 0)
                it1++;

             /* calc position of first pixel in tile to be copied */
             tilepix = tilefpix[0] + (tilefpix[1] + it1) * tiledim[0] + t2;

             /* offset to start of row */
             if (inc[1] > 0)
                im1 = (i1 + imgfpix[1]) * imgdim[0] + im2;
             else
                im1 = imgdim[1] - (i1 + 1 + imgfpix[1]) * imgdim[0] + im2;
/*
printf("inc = %d %d %d %d\n",inc[0],inc[1],inc[2],inc[3]);
printf("im1,im2,im3,im4 = %d %d %d %d\n",im1,im2,im3,im4);
*/
             /* offset to byte within the row */
             if (inc[0] > 0)
                imgpix = imgfpix[0] + im1;
             else
                imgpix = imgdim[0] - 1 - imgfpix[0] + im1;
/*
printf("tilefpix0,1, imgfpix1, it1, inc1, t2= %d %d %d %d %d %d\n",
       tilefpix[0],tilefpix[1],imgfpix[1],it1,inc[1], t2);
printf("i1, it1, tilepix, imgpix %d %d %d %d \n", i1, it1, tilepix, imgpix);
*/
             /* loop over pixels along one row of the image */
             for (ipos = imgfpix[0]; ipos <= imglpix[0]; ipos += overlap_flags)
             {
               if (nullcheck == 2)
               {
                   /* copy overlapping null flags from tile to image */
                   memcpy(nullarray + imgpix, bnullarray + tilepix,
                          overlap_flags);
               }

               /* convert from image pixel to byte offset */
               tilepixbyte = tilepix * pixlen;
               imgpixbyte  = imgpix  * pixlen;
/*
printf("  tilepix, tilepixbyte, imgpix, imgpixbyte= %d %d %d %d\n",
          tilepix, tilepixbyte, imgpix, imgpixbyte);
*/
               /* copy overlapping row of pixels from tile to image */
               memcpy(image + imgpixbyte, tile + tilepixbyte, overlap_bytes);

               tilepix += (overlap_flags * labs(inc[0]));
               if (inc[0] > 0)
                 imgpix += overlap_flags;
               else
                 imgpix -= overlap_flags;
            }
          }
        }
      }
    }
    return(*status);
}